

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

bool __thiscall spvtools::opt::IRContext::IsCombinatorInstruction(IRContext *this,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  uint32_t local_38;
  uint32_t local_34;
  uint32_t op;
  uint32_t set;
  undefined4 local_28;
  undefined4 local_24;
  uint32_t kExtInstInstructionInIndx;
  uint32_t kExtInstSetIdInIndx;
  Instruction *inst_local;
  IRContext *this_local;
  
  _kExtInstInstructionInIndx = inst;
  inst_local = (Instruction *)this;
  bVar1 = AreAnalysesValid(this,kAnalysisCombinators);
  if (!bVar1) {
    InitializeCombinators(this);
  }
  local_24 = 0;
  local_28 = 1;
  OVar2 = Instruction::opcode(_kExtInstInstructionInIndx);
  if (OVar2 == OpExtInst) {
    local_34 = Instruction::GetSingleWordInOperand(_kExtInstInstructionInIndx,0);
    local_38 = Instruction::GetSingleWordInOperand(_kExtInstInstructionInIndx,1);
    pmVar3 = std::
             unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](&this->combinator_ops_,&local_34);
    sVar4 = std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(pmVar3,&local_38);
  }
  else {
    set = 0;
    pmVar3 = std::
             unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](&this->combinator_ops_,&set);
    op = Instruction::opcode(_kExtInstInstructionInIndx);
    sVar4 = std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(pmVar3,&op);
  }
  this_local._7_1_ = sVar4 != 0;
  return this_local._7_1_;
}

Assistant:

inline bool IsCombinatorInstruction(const Instruction* inst) {
    if (!AreAnalysesValid(kAnalysisCombinators)) {
      InitializeCombinators();
    }
    constexpr uint32_t kExtInstSetIdInIndx = 0;
    constexpr uint32_t kExtInstInstructionInIndx = 1;

    if (inst->opcode() != spv::Op::OpExtInst) {
      return combinator_ops_[0].count(uint32_t(inst->opcode())) != 0;
    } else {
      uint32_t set = inst->GetSingleWordInOperand(kExtInstSetIdInIndx);
      auto op = inst->GetSingleWordInOperand(kExtInstInstructionInIndx);
      return combinator_ops_[set].count(op) != 0;
    }
  }